

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandlerManager.cpp
# Opt level: O0

void __thiscall
HandlerManager::registerCapabilities(HandlerManager *this,ServerCapabilities *capabilities)

{
  bool bVar1;
  reference ppRVar2;
  reference ppNVar3;
  NotificationHandler *handler_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<NotificationHandler_*,_std::allocator<NotificationHandler_*>_> *__range1_1;
  RequestHandler *handler;
  iterator __end1;
  iterator __begin1;
  vector<RequestHandler_*,_std::allocator<RequestHandler_*>_> *__range1;
  ServerCapabilities *capabilities_local;
  HandlerManager *this_local;
  
  __end1 = std::vector<RequestHandler_*,_std::allocator<RequestHandler_*>_>::begin
                     (&this->requestHandlers);
  handler = (RequestHandler *)
            std::vector<RequestHandler_*,_std::allocator<RequestHandler_*>_>::end
                      (&this->requestHandlers);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<RequestHandler_**,_std::vector<RequestHandler_*,_std::allocator<RequestHandler_*>_>_>
                                *)&handler);
    if (!bVar1) break;
    ppRVar2 = __gnu_cxx::
              __normal_iterator<RequestHandler_**,_std::vector<RequestHandler_*,_std::allocator<RequestHandler_*>_>_>
              ::operator*(&__end1);
    (**((*ppRVar2)->super_Handler)._vptr_Handler)(*ppRVar2,capabilities);
    __gnu_cxx::
    __normal_iterator<RequestHandler_**,_std::vector<RequestHandler_*,_std::allocator<RequestHandler_*>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<NotificationHandler_*,_std::allocator<NotificationHandler_*>_>::begin
                       (&this->notificationHandlers);
  handler_1 = (NotificationHandler *)
              std::vector<NotificationHandler_*,_std::allocator<NotificationHandler_*>_>::end
                        (&this->notificationHandlers);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<NotificationHandler_**,_std::vector<NotificationHandler_*,_std::allocator<NotificationHandler_*>_>_>
                        *)&handler_1);
    if (!bVar1) break;
    ppNVar3 = __gnu_cxx::
              __normal_iterator<NotificationHandler_**,_std::vector<NotificationHandler_*,_std::allocator<NotificationHandler_*>_>_>
              ::operator*(&__end1_1);
    (**((*ppNVar3)->super_Handler)._vptr_Handler)(*ppNVar3,capabilities);
    __gnu_cxx::
    __normal_iterator<NotificationHandler_**,_std::vector<NotificationHandler_*,_std::allocator<NotificationHandler_*>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

void HandlerManager::registerCapabilities (Init::ServerCapabilities &capabilities) {
    for (RequestHandler *handler : requestHandlers) {
        handler->registerCapabilities(capabilities);
    }

    for (NotificationHandler *handler : notificationHandlers) {
        handler->registerCapabilities(capabilities);
    }
}